

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_canonicalized_transform_base.h
# Opt level: O0

Point2 __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>::RotatePoint
          (PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int> *this,Point2 *p,
          int32_t rotation_count)

{
  VectorD<int,_2> *this_00;
  Scalar_conflict3 *pSVar1;
  int in_ECX;
  Self *in_RDX;
  _Type in_RDI;
  int in_stack_ffffffffffffffac;
  VectorD<int,_2> *in_stack_ffffffffffffffb0;
  array<int,_2UL> aVar2;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  
  aVar2._M_elems = in_RDI;
  if (in_ECX == 1) {
    this_00 = (VectorD<int,_2> *)
              VectorD<int,_2>::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    VectorD<int,_2>::operator[](this_00,in_stack_ffffffffffffffac);
    VectorD<int,_2>::VectorD
              ((VectorD<int,_2> *)CONCAT44(in_stack_ffffffffffffffd4,in_ECX),
               (Scalar_conflict3 *)aVar2._M_elems,(Scalar_conflict3 *)in_RDI);
  }
  else if (in_ECX == 2) {
    VectorD<int,_2>::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    VectorD<int,_2>::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    VectorD<int,_2>::VectorD
              ((VectorD<int,_2> *)CONCAT44(in_stack_ffffffffffffffd4,in_ECX),
               (Scalar_conflict3 *)aVar2._M_elems,(Scalar_conflict3 *)in_RDI);
  }
  else if (in_ECX == 3) {
    pSVar1 = VectorD<int,_2>::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    iVar3 = -*pSVar1;
    VectorD<int,_2>::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    VectorD<int,_2>::VectorD
              ((VectorD<int,_2> *)CONCAT44(iVar3,in_ECX),(Scalar_conflict3 *)aVar2._M_elems,
               (Scalar_conflict3 *)in_RDI);
  }
  else {
    VectorD<int,_2>::VectorD((VectorD<int,_2> *)in_RDI,in_RDX);
    aVar2._M_elems = in_RDI;
  }
  return (Point2)(array<int,_2UL>)aVar2._M_elems;
}

Assistant:

Point2 RotatePoint(Point2 p, int32_t rotation_count) const {
    switch (rotation_count) {
      case 1:
        return Point2(p[1], -p[0]);
      case 2:
        return Point2(-p[0], -p[1]);
      case 3:
        return Point2(-p[1], p[0]);
      default:
        return p;
    }
  }